

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

void do_move_forward_back
               (Am_Object *inter,Am_Object *widget,Am_Which_Sel_Direction dir,bool extend,
               Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  char *pcVar3;
  Am_Wrapper *pAVar4;
  ostream *poVar5;
  char *string;
  Am_Object *this;
  Am_Value obj_value;
  Am_Value_List new_value;
  Am_String label;
  Am_Object new_object;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Value_List old_value;
  Am_Object local_90;
  Am_Object local_88;
  Am_Value_List parts;
  Am_String local_70;
  Am_Object main_group;
  Am_Value local_60;
  Am_Value local_50;
  Am_Value local_40;
  
  pAVar2 = Am_Object::Get(widget,0x193,0);
  Am_Object::Am_Object(&main_group,pAVar2);
  pAVar2 = Am_Object::Get(&main_group,0x82,0);
  Am_Value_List::Am_Value_List(&parts,pAVar2);
  bVar1 = Am_Value_List::Valid(&parts);
  if (bVar1) {
    clear_multi_selections(widget);
    Am_Value_List::Am_Value_List(&new_value);
    if (dir != Am_Sel_NONE) {
      pAVar2 = Am_Object::Get(widget,0x169,3);
      Am_Value_List::Am_Value_List(&old_value,pAVar2);
      label.data = (Am_String_Data *)0x0;
      switch(dir) {
      case Am_Sel_FORWARD:
        toward_end((Am_Value_List *)&obj_value,&parts,SUB81(&old_value,0),false);
        Am_Value_List::operator=(&new_value,(Am_Value_List *)&obj_value);
        Am_Value_List::~Am_Value_List((Am_Value_List *)&obj_value);
        pcVar3 = "Extend Selection Forward";
        string = "Selection Forward";
        break;
      case Am_SEL_BACKWARD:
        toward_beginning((Am_Value_List *)&obj_value,&parts,SUB81(&old_value,0),false);
        Am_Value_List::operator=(&new_value,(Am_Value_List *)&obj_value);
        Am_Value_List::~Am_Value_List((Am_Value_List *)&obj_value);
        pcVar3 = "Extend Selection Backward";
        string = "Selection Backward";
        break;
      case Am_Sel_HOME:
        toward_beginning((Am_Value_List *)&obj_value,&parts,SUB81(&old_value,0),true);
        Am_Value_List::operator=(&new_value,(Am_Value_List *)&obj_value);
        Am_Value_List::~Am_Value_List((Am_Value_List *)&obj_value);
        pcVar3 = "Extend Selection To Beginning";
        string = "Select Beginning";
        break;
      case Am_Sel_END:
        toward_end((Am_Value_List *)&obj_value,&parts,SUB81(&old_value,0),true);
        Am_Value_List::operator=(&new_value,(Am_Value_List *)&obj_value);
        Am_Value_List::~Am_Value_List((Am_Value_List *)&obj_value);
        pcVar3 = "Extend Selection To End";
        string = "Select End";
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Bad direction ",0xe);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,dir);
        std::endl<char,std::char_traits<char>>(poVar5);
        Am_Error();
      }
      if (extend) {
        string = pcVar3;
      }
      Am_String::operator=(&label,string);
      bVar1 = Am_Value_List::Valid(&new_value);
      if (bVar1) {
        Am_Value_List::End(&new_value);
        pAVar2 = Am_Value_List::Get(&new_value);
        Am_Object::Am_Object(&new_object,pAVar2);
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_value);
        Am_Object::Set(widget,0x169,pAVar4,0);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
        Am_Value::Am_Value(&obj_value,pAVar4);
        Am_Value::Am_Value(&local_40,&obj_value);
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_value);
        Am_Value::Am_Value(&local_50,pAVar4);
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&old_value);
        Am_Value::Am_Value(&local_60,pAVar4);
        Am_String::Am_String(&local_70,&label);
        set_commands_for_sel
                  (command_obj,inter,widget,&local_40,&local_50,&local_60,true,
                   (Am_String_Data *)&local_70,dir,extend);
        Am_String::~Am_String(&local_70);
        Am_Value::~Am_Value(&local_60);
        Am_Value::~Am_Value(&local_50);
        Am_Value::~Am_Value(&local_40);
        Am_Value::~Am_Value(&obj_value);
        this = &new_object;
      }
      else {
        Am_Object::Am_Object(&local_a8,&Am_No_Object);
        Am_Beep(&local_a8);
        Am_Object::~Am_Object(&local_a8);
        Am_Object::Am_Object(&local_b0,inter);
        Am_Abort_Interactor(&local_b0,true);
        this = &local_b0;
      }
      Am_Object::~Am_Object(this);
      Am_String::~Am_String(&label);
      Am_Value_List::~Am_Value_List(&old_value);
    }
    Am_Value_List::~Am_Value_List(&new_value);
  }
  else {
    Am_Object::Am_Object(&local_88,&Am_No_Object);
    Am_Beep(&local_88);
    Am_Object::~Am_Object(&local_88);
    Am_Object::Am_Object(&local_90,inter);
    Am_Abort_Interactor(&local_90,true);
    Am_Object::~Am_Object(&local_90);
  }
  Am_Value_List::~Am_Value_List(&parts);
  Am_Object::~Am_Object(&main_group);
  return;
}

Assistant:

void
do_move_forward_back(Am_Object &inter, Am_Object &widget,
                     Am_Which_Sel_Direction dir, bool extend,
                     Am_Object command_obj)
{
  Am_Object main_group = widget.Get(Am_OPERATES_ON);
  Am_Value_List parts = main_group.Get(Am_GRAPHICAL_PARTS);
  if (!parts.Valid()) {
    Am_Beep();                  // cannot move further
    Am_Abort_Interactor(inter); //make sure not queued for undo
    return;                     //no parts, can't move forward or back
  }
  clear_multi_selections(widget);
  Am_Value_List new_value;
  if (dir == Am_Sel_NONE)
    return;

  Am_Value_List old_value = widget.Get(Am_VALUE, Am_RETURN_ZERO_ON_ERROR);
  Am_String label;
  switch (dir) {
  case Am_Sel_FORWARD:
    new_value = toward_end(parts, old_value, false, extend);
    if (extend)
      label = "Extend Selection Forward";
    else
      label = "Selection Forward";
    break;
  case Am_Sel_END:
    new_value = toward_end(parts, old_value, true, extend);
    if (extend)
      label = "Extend Selection To End";
    else
      label = "Select End";
    break;
  case Am_SEL_BACKWARD:
    new_value = toward_beginning(parts, old_value, false, extend);
    if (extend)
      label = "Extend Selection Backward";
    else
      label = "Selection Backward";
    break;
  case Am_Sel_HOME:
    new_value = toward_beginning(parts, old_value, true, extend);
    if (extend)
      label = "Extend Selection To Beginning";
    else
      label = "Select Beginning";
    break;
  default:
    Am_ERROR("Bad direction " << (int)dir);
  }
  if (!new_value.Valid()) {
    Am_Beep();                  // cannot move further
    Am_Abort_Interactor(inter); //make sure not queued for undo
    return;
  }
  new_value.End();
  Am_Object new_object = new_value.Get();
  Am_INTER_TRACE_PRINT(widget, "Selection handle "
                                   << widget << label
                                   << " new value = " << new_value);

  widget.Set(Am_VALUE, new_value);
  Am_Value obj_value = Am_Value(new_object);
  set_commands_for_sel(command_obj, inter, widget, obj_value,
                       Am_Value(new_value), Am_Value(old_value), true, label,
                       dir, extend);
}